

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_bbdpre.c
# Opt level: O0

int IDABBDPrecSetup(sunrealtype tt,N_Vector yy,N_Vector yp,N_Vector rr,sunrealtype c_j,
                   void *bbd_data)

{
  IDAMem IDA_mem_00;
  int iVar1;
  SUNLinearSolver in_RCX;
  int retval;
  IDAMem IDA_mem;
  IBBDPrecData pdata;
  N_Vector in_stack_000000d0;
  N_Vector in_stack_000000d8;
  N_Vector in_stack_000000e0;
  N_Vector in_stack_000000e8;
  N_Vector in_stack_000000f0;
  sunrealtype in_stack_000000f8;
  sunrealtype in_stack_00000100;
  IBBDPrecData in_stack_00000108;
  N_Vector in_stack_00000120;
  void *pvVar2;
  SUNLinearSolver S;
  int local_4;
  
  IDA_mem_00 = (IDAMem)in_RCX[6].ops;
  S = in_RCX;
  SUNMatZero(in_RCX[2].sunctx);
  pvVar2 = in_RCX[5].content;
  iVar1 = IBBDDQJac(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f0,
                    in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,
                    in_stack_00000120);
  if (iVar1 < 0) {
    IDAProcessError(IDA_mem_00,-1,0x1db,"IDABBDPrecSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_bbdpre.c"
                    ,"The Glocal or Gcomm routine failed in an unrecoverable manner.",pvVar2);
    local_4 = -1;
  }
  else if (iVar1 < 1) {
    local_4 = SUNLinSolSetup_Band(S,(SUNMatrix)in_RCX);
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int IDABBDPrecSetup(sunrealtype tt, N_Vector yy, N_Vector yp,
                           SUNDIALS_MAYBE_UNUSED N_Vector rr, sunrealtype c_j,
                           void* bbd_data)
{
  IBBDPrecData pdata;
  IDAMem IDA_mem;
  int retval;

  pdata = (IBBDPrecData)bbd_data;

  IDA_mem = (IDAMem)pdata->ida_mem;

  /* Call IBBDDQJac for a new Jacobian calculation and store in PP. */
  retval = SUNMatZero(pdata->PP);
  retval = IBBDDQJac(pdata, tt, c_j, yy, yp, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3, pdata->tempv4);
  if (retval < 0)
  {
    IDAProcessError(IDA_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }
  if (retval > 0) { return (1); }

  /* Do LU factorization of matrix and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}